

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

MatrixXd * ChebTools::Schur_matrixT(MatrixXd *__return_storage_ptr__,MatrixXd *A,bool balance)

{
  undefined7 in_register_00000011;
  MatrixXd Abalanced;
  MatrixXd D;
  RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> schur;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_f8;
  MatrixXd local_d8;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_c0;
  RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_a8;
  
  Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::RealSchur(&local_a8,1);
  if ((int)CONCAT71(in_register_00000011,balance) == 0) {
    local_f8.m_rows.m_value =
         (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_f8.m_cols.m_value =
         (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    if ((local_f8.m_cols.m_value | local_f8.m_rows.m_value) < 0) goto LAB_00135683;
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,A,&local_f8,false);
  }
  else {
    local_f8.m_rows.m_value = 0;
    local_f8.m_cols.m_value = 0;
    local_f8._16_8_ = 0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    balance_matrix(A,(MatrixXd *)&local_f8,&local_d8);
    local_c0.m_rows.m_value =
         (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_c0.m_cols.m_value =
         (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    if ((local_c0.m_cols.m_value | local_c0.m_rows.m_value) < 0) {
LAB_00135683:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_f8,&local_c0,false);
    free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free((void *)local_f8.m_rows.m_value);
  }
  if (local_a8.m_isInitialized != false) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
               (DenseStorage<double,__1,__1,__1,_0> *)&local_a8);
    free(local_a8.m_hess.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
         m_storage.m_data);
    free(local_a8.m_hess.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_a8.m_hess.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(local_a8.m_workspaceVector.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_a8.m_matU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    free(local_a8.m_matT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    return __return_storage_ptr__;
  }
  __assert_fail("m_isInitialized && \"RealSchur is not initialized.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/RealSchur.h"
                ,0x92,
                "const MatrixType &Eigen::RealSchur<Eigen::Matrix<double, -1, -1>>::matrixT() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

Eigen::MatrixXd Schur_matrixT(const Eigen::MatrixXd &A, bool balance){
        Eigen::RealSchur<Eigen::MatrixXd> schur;
        if (balance) {
            Eigen::MatrixXd Abalanced, D;
            balance_matrix(A, Abalanced, D);
            schur.computeFromHessenberg(Abalanced, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        else {
            schur.computeFromHessenberg(A, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        
        return schur.matrixT();
    }